

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void google::protobuf::compiler::cxx::anon_unknown_0::PrintFieldComment
               (Printer *printer,FieldDescriptor *field)

{
  string local_58;
  undefined1 local_38 [8];
  string def;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  def.field_2._8_8_ = field;
  FieldDescriptor::DebugString_abi_cxx11_((string *)local_38,field);
  std::__cxx11::string::find_first_of((char)(string *)local_38,10);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)local_38);
  io::Printer::Print(printer,"// $def$\n","def",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void PrintFieldComment(io::Printer* printer, const FieldDescriptor* field) {
  // Print the field's proto-syntax definition as a comment.  We don't want to
  // print group bodies so we cut off after the first line.
  string def = field->DebugString();
  printer->Print("// $def$\n",
    "def", def.substr(0, def.find_first_of('\n')));
}